

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldIon
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double massNum,double atomNum,
          vector<double,_std::allocator<double>_> *NRYieldsParam)

{
  bool bVar1;
  int iVar2;
  RandomGen *pRVar3;
  int64_t iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_160;
  YieldResult result;
  double Ly;
  double qu;
  double Qy;
  double factorE;
  double Ne;
  double Nph;
  double recombProb;
  double Ni;
  double Nq;
  double Wq_eV;
  double logden;
  double NexONi;
  double alpha;
  double ThomasImel;
  double eneDep;
  double fieldDep;
  double massDep;
  double densDep;
  double L_max;
  double L;
  double Constant;
  double Ec_eV;
  double gamma;
  double E2c;
  double E1c;
  double Z_mean;
  double Z2;
  double Z1;
  double A2;
  double A1;
  vector<double,_std::allocator<double>_> *NRYieldsParam_local;
  double atomNum_local;
  double massNum_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  pRVar3 = RandomGen::rndm();
  iVar2 = RandomGen::SelectRanXeAtom(pRVar3);
  dVar5 = (double)iVar2;
  dVar6 = pow(atomNum,0.6666666666666666);
  dVar7 = pow(54.0,0.6666666666666666);
  dVar6 = pow(dVar6 + dVar7,1.5);
  dVar7 = pow(massNum,3.0);
  dVar8 = pow(massNum + dVar5,-2.0);
  dVar6 = pow(dVar6,1.3333333333333333);
  dVar9 = pow(atomNum,-0.3333333333333333);
  dVar10 = pow(massNum + dVar5,2.0);
  dVar11 = pow(massNum,-1.0);
  dVar12 = pow(massNum + dVar5,2.0);
  dVar12 = (massNum * 4.0 * dVar5) / dVar12;
  dVar5 = sqrt(dVar7 * dVar8 * dVar6 * dVar9 * 500.0);
  dVar6 = sqrt(dVar12 / (dVar12 * dVar10 * dVar11 * 54.0 * 125.0));
  dVar7 = sqrt(energy * 1000.0);
  L_max = (dVar6 * 0.5 + 1.0 / dVar5) * 0.6666666666666666 * dVar7;
  dVar5 = pow((massNum * massNum) / 19227.0,0.99199);
  dVar5 = 0.96446 / (dVar5 + 1.0);
  bVar1 = ValidityTests::nearlyEqual(atomNum,2.0,1e-09);
  if ((bVar1) && (bVar1 = ValidityTests::nearlyEqual(massNum,4.0,1e-09), bVar1)) {
    dVar6 = pow(energy,0.056972);
    L_max = dVar6 * 0.56136;
  }
  if (dVar5 < L_max) {
    L_max = dVar5;
  }
  dVar5 = pow(density / 0.2679,-2.3245);
  dVar6 = exp((massNum / 4.0 - 1.0) * 0.17687876);
  dVar7 = pow(dfield,0.515);
  eneDep = dVar7 * 0.095 + -0.025;
  if (eneDep < 0.0) {
    eneDep = 0.0;
  }
  bVar1 = VDetector::get_inGas(this->fdetector);
  if (bVar1) {
    eneDep = sqrt(dfield);
  }
  ThomasImel = energy * -0.0013 + 0.13;
  if (ThomasImel < 0.0) {
    ThomasImel = 0.0;
  }
  alpha = ((((dVar6 * 0.02966094 + 1.0) - 0.02966094) * 0.00625) / (dVar5 + 1.0)) / eneDep +
          ThomasImel;
  dVar5 = pow(density / 10.0,2.0);
  dVar5 = pow(dVar5 + 1.0,449.61);
  dVar6 = pow(atomNum,1.587);
  logden = dVar6 * 0.00178 + 0.64 / dVar5;
  bVar1 = ValidityTests::nearlyEqual(massNum,206.0,1e-09);
  if ((bVar1) && (bVar1 = ValidityTests::nearlyEqual(atomNum,82.0,1e-09), bVar1)) {
    alpha = exp(dfield * -0.00142053 + -1.28683);
    logden = 1.1;
  }
  dVar5 = log10(density);
  dVar6 = pow(dVar5,2.0);
  dVar7 = pow(dVar5,3.0);
  dVar8 = pow(dVar5,4.0);
  dVar9 = pow(dVar5,5.0);
  dVar10 = pow(dVar5,6.0);
  dVar11 = pow(dVar5,7.0);
  Nq = dVar11 * -2.2352 +
       dVar10 * -20.276 +
       dVar9 * -74.194 +
       dVar8 * -136.47 + dVar7 * -123.73 + dVar6 * -33.611 + dVar5 * 25.667 + 28.259;
  Ni = (L_max * 1000.0 * energy) / Nq;
  bVar1 = VDetector::get_OldW13eV(this->fdetector);
  if (!bVar1) {
    Ni = Ni * 1.1716263232;
  }
  dVar5 = Ni / (logden + 1.0);
  if ((dVar5 <= 0.0) || (alpha <= 0.0)) {
    Nph = 0.0;
  }
  else {
    dVar6 = log((alpha / 4.0) * dVar5 + 1.0);
    Nph = 1.0 - dVar6 / ((alpha / 4.0) * dVar5);
  }
  Ne = Nph * dVar5 + (Ni * logden) / (logden + 1.0);
  factorE = Ni - Ne;
  bVar1 = ValidityTests::nearlyEqual(massNum,206.0,1e-09);
  if ((bVar1) && (bVar1 = ValidityTests::nearlyEqual(atomNum,82.0,1e-09), bVar1)) {
    pRVar3 = RandomGen::rndm();
    iVar4 = RandomGen::binom_draw(pRVar3,(long)factorE,1.0);
    factorE = (double)iVar4;
  }
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (((bVar1) && (bVar1 = ValidityTests::nearlyEqual(atomNum,2.0,1e-09), bVar1)) &&
     (bVar1 = ValidityTests::nearlyEqual(massNum,4.0,1e-09), bVar1)) {
    dVar5 = pow(dfield,7.72848);
    dVar5 = pow(dVar5 + 4.71598,0.109802);
    dVar6 = log(((0.01 / dVar5) / 3.0) * 53287932.86471075 + 1.0);
    dVar7 = pow(dfield,-0.012);
    dVar8 = pow(dfield / 10.0822,1.2076);
    dVar8 = pow(dVar8 + 4.98483,0.97977);
    dVar9 = log(((0.653503 / dVar8) / 3.0) * 229782.85147355372 + 1.0);
    result.DeltaT_Scint =
         (1.0 / (dVar7 * 1.16)) * 0.00015384615384615385 *
         ((1.0 - (dVar9 * 2.0) / ((0.653503 / dVar8) * 229782.85147355372)) * 229782.85147355372 +
         48254.39880714845);
    factorE = (64478398.7663 -
              ((1.0 - (dVar6 * 0.02852) / ((0.01 / dVar5) * 53287932.86471075)) * 53287932.86471075
              + 11190465.901056377)) * 0.00016129032258064516 * energy;
    Ne = result.DeltaT_Scint * energy;
    L_max = 0.0;
    logden = 0.21;
    Nq = 19.5;
  }
  memset(&local_160,0,0x30);
  local_160 = Ne;
  result.PhotonYield = factorE;
  result.ElectronYield = logden;
  result.ExcitonRatio = L_max;
  result.ElectricField = -999.0;
  result.Lindhard = dfield;
  (*this->_vptr_NESTcalc[0xb])(energy,Nq,__return_storage_ptr__,this,&local_160);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldIon(
    double energy, double density, double dfield, double massNum,
    double atomNum,
    const std::vector<double>
        &NRYieldsParam) {  // simply uses the original Lindhard model, but as
                           // cited by Hitachi in:
  // https://indico.cern.ch/event/573069/sessions/230063/attachments/1439101/2214448/Hitachi_XeSAT2017_DM.pdf

  double A1 = massNum, A2 = RandomGen::rndm()->SelectRanXeAtom();
  double Z1 = atomNum, Z2 = ATOM_NUM;
  double Z_mean = pow(pow(Z1, (2. / 3.)) + pow(Z2, (2. / 3.)), 1.5);
  double E1c = pow(A1, 3.) * pow(A1 + A2, -2.) * pow(Z_mean, (4. / 3.)) *
               pow(Z1, (-1. / 3.)) * 500.;
  double E2c = pow(A1 + A2, 2.) * pow(A1, -1.) * Z2 * 125.;
  double gamma = 4. * A1 * A2 / pow(A1 + A2, 2.);
  double Ec_eV = gamma * E2c;
  double Constant = (2. / 3.) * (1. / sqrt(E1c) + 0.5 * sqrt(gamma / Ec_eV));
  double L = Constant * sqrt(energy * 1e3);
  double L_max = 0.96446 / (1. + pow(massNum * massNum / 19227., 0.99199));
  if (ValidityTests::nearlyEqual(atomNum, 2.) &&
      ValidityTests::nearlyEqual(massNum, 4.))
    L = 0.56136 * pow(energy, 0.056972);
  if (L > L_max) L = L_max;
  double densDep = pow(density / 0.2679, -2.3245);
  double massDep =
      0.02966094 * exp(0.17687876 * (massNum / 4. - 1.)) + 1. - 0.02966094;
  double fieldDep = 0.095*pow(dfield,0.515)-0.025; if ( fieldDep < 0. ) fieldDep = 0.;
  if (fdetector->get_inGas()) fieldDep = sqrt(dfield);
  double eneDep = 0.13 - 0.0013 * energy; if ( eneDep < 0. ) eneDep = 0.;
  double ThomasImel = 0.00625 * massDep / (1. + densDep) / fieldDep + eneDep;
  double alpha = 0.64 / pow(1. + pow(density / 10., 2.), 449.61);
  double NexONi = alpha + 0.00178 * pow(atomNum, 1.587);
  if (ValidityTests::nearlyEqual(A1, 206.) &&
      ValidityTests::nearlyEqual(Z1,
                                 82.)) {  // Pb-206 (from Po-210 alpha decay).
    ThomasImel =
        exp(-1.28683 - 1.42053e-03 * dfield);  // updated by Nishat Parveen
    NexONi = 1.1;                              // updated by Nishat Parveen
  }
  const double logden = log10(density);
  double Wq_eV = 28.259 + 25.667 * logden - 33.611 * pow(logden, 2.) -
                 123.73 * pow(logden, 3.) - 136.47 * pow(logden, 4.) -
                 74.194 * pow(logden, 5.) - 20.276 * pow(logden, 6.) -
                 2.2352 * pow(logden, 7.);
  double Nq = 1e3 * L * energy / Wq_eV;
  if (!fdetector->get_OldW13eV()) Nq *= ZurichEXOW;
  double Ni = Nq / (1. + NexONi);
  double recombProb;
  if (Ni > 0. && ThomasImel > 0.)
    recombProb =
        1. - log(1. + (ThomasImel / 4.) * Ni) / ((ThomasImel / 4.) * Ni);
  else {
    recombProb = 0.0;
  }
  double Nph = Nq * NexONi / (1. + NexONi) + recombProb * Ni;
  double Ne = Nq - Nph;
  if (ValidityTests::nearlyEqual(A1, 206.) &&
      ValidityTests::nearlyEqual(Z1, 82.))
    Ne = RandomGen::rndm()->binom_draw(Ne, ChargeLoss);
  // some electrons from lead recoils get absorbed by the Teflon wall
  if (ValidityTests::nearlyEqual(Z2, 18.) &&
      ValidityTests::nearlyEqual(Z1, 2.) &&
      ValidityTests::nearlyEqual(A1, 4.)) {  // alphas in argon
    double factorE = pow((4.71598 + pow(dfield, 7.72848)), 0.109802);
    double Qy = (1. / 6200.) *
                (64478398.7663 -
                 (64478398.7663 * 0.173553719 +
                  (64478398.7663 / 1.21) *
                      (1. - (0.02852 * log(1. + (64478398.7663 / 1.21) *
                                                    ((0.01 / factorE) / 3.))) /
                                ((64478398.7663 / 1.21) * (0.01 / factorE)))));
    double qu = 1. / (1.16 * pow(dfield, -0.012));
    factorE = pow(4.98483 + pow(dfield / 10.0822, 1.2076), 0.97977);
    double Ly =
        qu * (1. / 6500.) *
        (278037.250283 * 0.173553719 +
         (278037.250283 / 1.21) *
             (1. - (2. * log(1. + (278037.250283 / 1.21) *
                                      ((0.653503 / factorE) / 3.))) /
                       ((278037.250283 / 1.21) * (0.653503 / factorE))));
    Ne = Qy * energy;
    Nph = Ly * energy;
    L = 0.0;
    NexONi = 0.21;
    Wq_eV = 19.5;
  }

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = NexONi;
  result.Lindhard = L;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}